

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

u_char * ngx_pstrdup(ngx_pool_t *pool,ngx_str_t *src)

{
  void *__dest;
  u_char *puVar1;
  
  __dest = ngx_pnalloc(pool,src->len);
  if (__dest != (void *)0x0) {
    puVar1 = (u_char *)memcpy(__dest,src->data,src->len);
    return puVar1;
  }
  return (u_char *)0x0;
}

Assistant:

u_char *
ngx_pstrdup(ngx_pool_t *pool, ngx_str_t *src)
{
    u_char  *dst;

    dst = ngx_pnalloc(pool, src->len);
    if (dst == NULL) {
        return NULL;
    }

    ngx_memcpy(dst, src->data, src->len);

    return dst;
}